

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_extrh_i64_i32_x86_64(TCGContext *tcg_ctx,TCGv_i32 ret,TCGv_i64 arg)

{
  TCGTemp *pTVar1;
  TCGOp *pTVar2;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i64 ret_00;
  
  pTVar1 = tcg_temp_new_internal_x86_64(tcg_ctx,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)pTVar1 - (long)tcg_ctx);
  tcg_gen_shri_i64_x86_64(tcg_ctx,ret_00,arg,0x20);
  if (ret_00 != (TCGv_i64)ret) {
    pTVar2 = tcg_emit_op_x86_64(tcg_ctx,INDEX_op_mov_i32);
    pTVar2->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar2->args[1] = (TCGArg)pTVar1;
  }
  tcg_temp_free_internal_x86_64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_extrh_i64_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i64 arg)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_mov_i32(tcg_ctx, ret, TCGV_HIGH(tcg_ctx, arg));
#elif TCG_TARGET_HAS_extrh_i64_i32
        tcg_gen_op2(tcg_ctx, INDEX_op_extrh_i64_i32,
                    tcgv_i32_arg(tcg_ctx, ret), tcgv_i64_arg(tcg_ctx, arg));
#else
        TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_shri_i64(tcg_ctx, t, arg, 32);
        tcg_gen_mov_i32(tcg_ctx, ret, (TCGv_i32)t);
        tcg_temp_free_i64(tcg_ctx, t);
#endif
}